

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::ArgOut<true>
          (ByteCodeWriter *this,ArgSlot arg,RegSlot reg,ProfileId callSiteId,bool emitProfiledArgout
          )

{
  code *pcVar1;
  bool bVar2;
  RegSlot reg_00;
  undefined4 *puVar3;
  uint byteSize;
  ProfileId *data;
  ArgSlot local_3e;
  RegSlot local_3c;
  ArgSlot local_38;
  RegSlot local_36;
  ProfileId local_32 [4];
  ProfileId callSiteId_local;
  
  local_32[0] = callSiteId;
  CheckOpen(this);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(ArgOut_A);
  if ((!bVar2) || (bVar2 = OpCodeAttr::HasMultiSizeLayout(ArgOut_ANonVar), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x2c3,
                                "(OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_A) && OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_ANonVar))"
                                ,
                                "OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_A) && OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_ANonVar)"
                               );
    if (!bVar2) goto LAB_008aa30f;
    *puVar3 = 0;
  }
  if (reg != 0xffffffff) {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_008aa30f;
      *puVar3 = 0;
    }
    reg_00 = FunctionBody::MapRegSlot(this->m_functionWrite,reg);
    if ((((emitProfiledArgout) &&
         (bVar2 = DoDynamicProfileOpcode(this,InlinePhase,false), 1 < reg_00)) &&
        ((ushort)(arg - 1) < 0xc)) && ((bVar2 && (local_32[0] != 0xffff)))) {
      bVar2 = TryWriteArg<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,ProfiledArgOut_A,arg,reg_00)
      ;
      if ((!bVar2) &&
         (bVar2 = TryWriteArg<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                            (this,ProfiledArgOut_A,arg,reg_00), !bVar2)) {
        local_38 = arg;
        local_36 = reg_00;
        Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,ProfiledArgOut_A,this);
        Data::Write(&this->m_byteCodeData,&local_38,6);
      }
      data = local_32;
      byteSize = 2;
    }
    else {
      bVar2 = TryWriteArg<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,ArgOut_A,arg,reg_00);
      if (bVar2) {
        return;
      }
      bVar2 = TryWriteArg<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,ArgOut_A,arg,reg_00);
      if (bVar2) {
        return;
      }
      data = &local_3e;
      local_3e = arg;
      local_3c = reg_00;
      Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,ArgOut_A,this);
      byteSize = 6;
    }
    Data::Write(&this->m_byteCodeData,data,byteSize);
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_008aa30f:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::ArgOut(ArgSlot arg, RegSlot reg, ProfileId callSiteId, bool emitProfiledArgout)
    {
        CheckOpen();
        Assert(OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_A) && OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_ANonVar));

        // Note: don't "consume" the arg slot, as the passed-in value is the final one.
        reg = ConsumeReg(reg);

        OpCode op;
        if (isVar)
        {
            op = OpCode::ArgOut_A;
        }
        else
        {
            op = OpCode::ArgOut_ANonVar;
            MULTISIZE_LAYOUT_WRITE(Arg, op, arg, reg);
            return;
        }

        if (emitProfiledArgout
            && DoDynamicProfileOpcode(InlinePhase)
            && arg > 0 && arg < Js::Constants::MaximumArgumentCountForConstantArgumentInlining
            && reg > FunctionBody::FirstRegSlot
            && callSiteId != Js::Constants::NoProfileId
            )
        {
            MULTISIZE_LAYOUT_WRITE(Arg, Js::OpCode::ProfiledArgOut_A, arg, reg);
            m_byteCodeData.Encode(&callSiteId, sizeof(Js::ProfileId));
        }
        else
        {
            MULTISIZE_LAYOUT_WRITE(Arg, op, arg, reg);
            return;
        }
    }